

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::binary<double,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_>::call
          (binary<double,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  double local_78;
  double result;
  Vector<double,_4> arg_2;
  Vector<double,_4> arg_1;
  functionPointer p_function;
  GLuint argument_1_stride;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  binary<double,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this_local;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)(arg_2.m_data + 3));
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)&result);
  unpack<tcu::Vector<double,_4>_>::get(argument_src,(Vector<double,_4> *)(arg_2.m_data + 3));
  unpack<tcu::Vector<double,_4>_>::get
            ((GLvoid *)((long)argument_src + (ulong)GVar2),(Vector<double,_4> *)&result);
  local_78 = (double)(*pcVar1)(arg_2.m_data + 3,&result);
  pack<double>::set(result_dst,&local_78);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}